

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::Function::SharedDtor(Function *this)

{
  Arena *pAVar1;
  LogMessage *other;
  string *default_value;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  Function *local_10;
  Function *this_local;
  
  local_10 = this;
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar1 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0x449);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->opset_,default_value);
  return;
}

Assistant:

inline void Function::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  opset_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}